

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O1

void __thiscall Parse::SMTLIB2::readBenchmark(SMTLIB2 *this,LExprList *bench)

{
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ***pppDVar1;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  **ppDVar2;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *pDVar3;
  bool bVar4;
  Expression **ppEVar5;
  SMTLIB2 *this_00;
  bool bVar6;
  int iVar7;
  uint uVar8;
  LExpr *pLVar9;
  LExprList *pLVar10;
  TermLookup *pTVar11;
  LExprList *pLVar12;
  LExpr *pLVar13;
  undefined7 extraout_var;
  undefined8 extraout_RAX;
  List<Shell::LispParser::Expression_*> *pLVar14;
  undefined8 *puVar15;
  long *plVar16;
  size_type *psVar17;
  long *plVar18;
  Color color;
  undefined8 uVar19;
  string *this_01;
  _Alloc_hider _Var20;
  void **head;
  LispListReader ibRdr;
  string arity;
  string name;
  LispListReader bRdr;
  LispListReader iSortRdr;
  LispListReader iArgRdr;
  uint in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff89c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8a0;
  Iterator local_758;
  SMTLIB2 *local_750;
  undefined1 local_748 [32];
  string local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  string local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  Iterator local_6a8;
  string local_6a0;
  uint local_67c;
  Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
  *local_678;
  FixedSizeAllocator<48UL> *local_670;
  ulong local_668;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string *local_2c0;
  string *local_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  undefined4 uStack_298;
  undefined4 uStack_294;
  long *local_290;
  long local_288;
  long local_280;
  undefined4 uStack_278;
  undefined4 uStack_274;
  long *local_270;
  long local_268;
  long local_260;
  undefined4 uStack_258;
  undefined4 uStack_254;
  long *local_250;
  long local_248;
  long local_240;
  undefined4 uStack_238;
  undefined4 uStack_234;
  long *local_230;
  long local_228;
  long local_220;
  undefined4 uStack_218;
  undefined4 uStack_214;
  long *local_210;
  long local_208;
  long local_200;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  undefined4 uStack_198;
  undefined4 uStack_194;
  long *local_190;
  long local_188;
  long local_180;
  undefined4 uStack_178;
  undefined4 uStack_174;
  long *local_170;
  long local_168;
  long local_160;
  undefined4 uStack_158;
  undefined4 uStack_154;
  long *local_150;
  long local_148;
  long local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  long *local_130;
  long local_128;
  long local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_678 = &this->_scopes;
  local_2c0 = (string *)&this->_sourceInfo;
  local_2b8 = (string *)&this->_statusStr;
  local_668 = 0;
  local_670 = (FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60);
  local_750 = this;
  local_6a8._lst = bench;
  do {
    if (local_6a8._lst == (LExprList *)0x0) break;
    pLVar9 = Shell::LispListReader::readNext((LispListReader *)&local_6a8);
    local_750->_topLevelExpr = pLVar9;
    local_750->_nextVar = 0;
    Shell::LispListReader::LispListReader((LispListReader *)&local_758,pLVar9);
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"set-logic","");
    bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    this_00 = local_750;
    if (bVar6) {
      if (local_750->_logicSet == true) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
        local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_708,"set-logic can appear only once in a problem","");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_708);
        local_748._0_8_ = *plVar16;
        psVar17 = (size_type *)(plVar16 + 2);
        if ((size_type *)local_748._0_8_ == psVar17) {
          local_748._16_8_ = *psVar17;
          local_748._24_8_ = plVar16[3];
          local_748._0_8_ = local_748 + 0x10;
        }
        else {
          local_748._16_8_ = *psVar17;
        }
        local_748._8_8_ = plVar16[1];
        *plVar16 = (long)psVar17;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        Shell::LispParser::Expression::toString_abi_cxx11_(&local_6e8,local_750->_topLevelExpr,true)
        ;
        std::operator+(in_stack_fffffffffffff8a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_728);
        local_130 = (long *)*plVar16;
        plVar18 = plVar16 + 2;
        if (local_130 == plVar18) {
          local_120 = *plVar18;
          uStack_118 = (undefined4)plVar16[3];
          uStack_114 = *(undefined4 *)((long)plVar16 + 0x1c);
          local_130 = &local_120;
        }
        else {
          local_120 = *plVar18;
        }
        local_128 = plVar16[1];
        *plVar16 = (long)plVar18;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        *puVar15 = &PTR_cry_00b69f40;
        puVar15[1] = puVar15 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar15 + 1),local_130,local_128 + (long)local_130);
        *puVar15 = &PTR_cry_00b6a028;
        *(undefined4 *)(puVar15 + 5) = 0;
        puVar15[6] = puVar15 + 8;
        puVar15[7] = 0;
        *(undefined1 *)(puVar15 + 8) = 0;
        __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                    ::Lib::UserErrorException::~UserErrorException);
      }
      Shell::LispListReader::readAtom_abi_cxx11_(&local_728,(LispListReader *)&local_758);
      readLogic(this_00,&local_728);
LAB_00631eae:
      uVar19 = local_728.field_2._M_allocated_capacity;
      _Var20._M_p = local_728._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_728._M_dataplus._M_p != &local_728.field_2) {
LAB_00631ec2:
        operator_delete(_Var20._M_p,uVar19 + 1);
      }
LAB_00631ecf:
      Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
LAB_00631ed4:
      bVar4 = true;
    }
    else {
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"set-info","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_300);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,":status","");
        bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_320);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if (bVar6) {
          Shell::LispListReader::readAtom_abi_cxx11_(&local_728,(LispListReader *)&local_758);
          this_01 = local_2b8;
LAB_00631ea6:
          std::__cxx11::string::operator=(this_01,(string *)&local_728);
          goto LAB_00631eae;
        }
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,":source","");
        bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if (bVar6) {
          Shell::LispListReader::readAtom_abi_cxx11_(&local_728,(LispListReader *)&local_758);
          this_01 = local_2c0;
          goto LAB_00631ea6;
        }
        Shell::LispListReader::readAtom_abi_cxx11_(&local_50,(LispListReader *)&local_758);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        Shell::LispListReader::readAtom_abi_cxx11_(&local_70,(LispListReader *)&local_758);
        uVar19 = local_70.field_2._M_allocated_capacity;
        _Var20._M_p = local_70._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_00631ecf;
        goto LAB_00631ec2;
      }
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"declare-sort","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_360);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        Shell::LispListReader::readAtom_abi_cxx11_(&local_728,(LispListReader *)&local_758);
        local_748._0_8_ = local_748 + 0x10;
        local_748._8_8_ = (TermList *)0x0;
        local_748._16_8_ = local_748._16_8_ & 0xffffffffffffff00;
        bVar6 = Shell::LispListReader::tryReadAtom((LispListReader *)&local_758,(string *)local_748)
        ;
        if (!bVar6) {
          puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
          std::operator+(&local_6c8,"Unspecified arity while declaring sort: ",&local_728);
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_6c8);
          local_6e8._M_dataplus._M_p = (pointer)*plVar16;
          psVar17 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_6e8._M_dataplus._M_p == psVar17) {
            local_6e8.field_2._M_allocated_capacity = *psVar17;
            local_6e8.field_2._8_8_ = plVar16[3];
            local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          }
          else {
            local_6e8.field_2._M_allocated_capacity = *psVar17;
          }
          local_6e8._M_string_length = plVar16[1];
          *plVar16 = (long)psVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Shell::LispParser::Expression::toString_abi_cxx11_
                    (&local_6a0,local_750->_topLevelExpr,true);
          std::operator+(in_stack_fffffffffffff8a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_708);
          local_150 = (long *)*plVar16;
          plVar18 = plVar16 + 2;
          if (local_150 == plVar18) {
            local_140 = *plVar18;
            uStack_138 = (undefined4)plVar16[3];
            uStack_134 = *(undefined4 *)((long)plVar16 + 0x1c);
            local_150 = &local_140;
          }
          else {
            local_140 = *plVar18;
          }
          local_148 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          *puVar15 = &PTR_cry_00b69f40;
          puVar15[1] = puVar15 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar15 + 1),local_150,local_148 + (long)local_150);
          *puVar15 = &PTR_cry_00b6a028;
          *(undefined4 *)(puVar15 + 5) = 0;
          puVar15[6] = puVar15 + 8;
          puVar15[7] = 0;
          *(undefined1 *)(puVar15 + 8) = 0;
          __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        readDeclareSort(local_750,&local_728,(string *)local_748);
        Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
        if ((LExprList *)local_748._0_8_ != (LExprList *)(local_748 + 0x10)) {
          operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
        }
LAB_00632244:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_728._M_dataplus._M_p != &local_728.field_2) {
          operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00631ed4;
      }
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"define-sort","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_380);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        Shell::LispListReader::readAtom_abi_cxx11_(&local_728,(LispListReader *)&local_758);
        pLVar10 = Shell::LispListReader::readList((LispListReader *)&local_758);
        if (local_758._lst == (LExprList *)0x0) {
          puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6e8,"define-sort expects a sort definition body","");
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_6e8);
          local_708._M_dataplus._M_p = (pointer)*plVar16;
          psVar17 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_708._M_dataplus._M_p == psVar17) {
            local_708.field_2._M_allocated_capacity = *psVar17;
            local_708.field_2._8_8_ = plVar16[3];
            local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
          }
          else {
            local_708.field_2._M_allocated_capacity = *psVar17;
          }
          local_708._M_string_length = plVar16[1];
          *plVar16 = (long)psVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Shell::LispParser::Expression::toString_abi_cxx11_
                    (&local_6c8,local_750->_topLevelExpr,true);
          std::operator+(in_stack_fffffffffffff8a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          plVar16 = (long *)std::__cxx11::string::append(local_748);
          local_170 = (long *)*plVar16;
          plVar18 = plVar16 + 2;
          if (local_170 == plVar18) {
            local_160 = *plVar18;
            uStack_158 = (undefined4)plVar16[3];
            uStack_154 = *(undefined4 *)((long)plVar16 + 0x1c);
            local_170 = &local_160;
          }
          else {
            local_160 = *plVar18;
          }
          local_168 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          *puVar15 = &PTR_cry_00b69f40;
          puVar15[1] = puVar15 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar15 + 1),local_170,local_168 + (long)local_170);
          *puVar15 = &PTR_cry_00b6a028;
          *(undefined4 *)(puVar15 + 5) = 0;
          puVar15[6] = puVar15 + 8;
          puVar15[7] = 0;
          *(undefined1 *)(puVar15 + 8) = 0;
          __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        pLVar9 = Shell::LispListReader::readNext((LispListReader *)&local_758);
        readDefineSort(local_750,&local_728,pLVar10,pLVar9);
        Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
        goto LAB_00632244;
      }
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"declare-fun","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        Shell::LispListReader::readAtom_abi_cxx11_(&local_728,(LispListReader *)&local_758);
        pLVar10 = Shell::LispListReader::readList((LispListReader *)&local_758);
        local_6a0._M_dataplus._M_p = (pointer)pLVar10;
        pTVar11 = (TermLookup *)::Lib::FixedSizeAllocator<48UL>::alloc(local_670);
        pTVar11->_timestamp = 1;
        pTVar11->_size = 0;
        pTVar11->_deleted = 0;
        pTVar11->_capacityIndex = 0;
        pTVar11->_capacity = 0;
        *(undefined8 *)&pTVar11->_nextExpansionOccupancy = 0;
        *(undefined8 *)((long)&pTVar11->_entries + 4) = 0;
        *(undefined4 *)((long)&pTVar11->_afterLast + 4) = 0;
        if ((local_750->_scopes)._cursor == (local_750->_scopes)._end) {
          ::Lib::
          Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
          ::expand(local_678);
        }
        *(local_750->_scopes)._cursor = pTVar11;
        pppDVar1 = &(local_750->_scopes)._cursor;
        *pppDVar1 = *pppDVar1 + 1;
        if (((LExprList *)local_6a0._M_dataplus._M_p != (LExprList *)0x0) &&
           (pLVar9 = Shell::LispListReader::peekAtNext((LispListReader *)&local_6a0),
           pLVar9->tag == ATOM)) {
          pLVar9 = Shell::LispListReader::peekAtNext((LispListReader *)&local_6a0);
          iVar7 = std::__cxx11::string::compare((char *)&pLVar9->str);
          if (iVar7 == 0) {
            Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
            Shell::LispListReader::readAtom_abi_cxx11_(&local_90,(LispListReader *)&local_6a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            readTypeParameters(local_750,(LispListReader *)&local_6a0,pTVar11,(TermStack *)0x0);
            pLVar10 = Shell::LispListReader::readList((LispListReader *)&local_6a0);
            local_758._lst = (List<Shell::LispParser::Expression_*> *)local_6a0._M_dataplus._M_p;
          }
        }
        if (local_758._lst == (LExprList *)0x0) {
          puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6e8,"declare-fun expects an output sort","");
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_6e8);
          local_708._M_dataplus._M_p = (pointer)*plVar16;
          psVar17 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_708._M_dataplus._M_p == psVar17) {
            local_708.field_2._M_allocated_capacity = *psVar17;
            local_708.field_2._8_8_ = plVar16[3];
            local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
          }
          else {
            local_708.field_2._M_allocated_capacity = *psVar17;
          }
          local_708._M_string_length = plVar16[1];
          *plVar16 = (long)psVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Shell::LispParser::Expression::toString_abi_cxx11_
                    (&local_6c8,local_750->_topLevelExpr,true);
          std::operator+(in_stack_fffffffffffff8a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          plVar16 = (long *)std::__cxx11::string::append(local_748);
          local_190 = (long *)*plVar16;
          plVar18 = plVar16 + 2;
          if (local_190 == plVar18) {
            local_180 = *plVar18;
            uStack_178 = (undefined4)plVar16[3];
            uStack_174 = *(undefined4 *)((long)plVar16 + 0x1c);
            local_190 = &local_180;
          }
          else {
            local_180 = *plVar18;
          }
          local_188 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          *puVar15 = &PTR_cry_00b69f40;
          puVar15[1] = puVar15 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar15 + 1),local_190,local_188 + (long)local_190);
          *puVar15 = &PTR_cry_00b6a028;
          *(undefined4 *)(puVar15 + 5) = 0;
          puVar15[6] = puVar15 + 8;
          puVar15[7] = 0;
          *(undefined1 *)(puVar15 + 8) = 0;
          __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        pLVar9 = Shell::LispListReader::readNext((LispListReader *)&local_758);
        readDeclareFun(local_750,&local_728,pLVar10,pLVar9,pTVar11->_size);
        Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
LAB_0063220a:
        ppDVar2 = (local_750->_scopes)._cursor;
        (local_750->_scopes)._cursor = ppDVar2 + -1;
        pDVar3 = ppDVar2[-1];
        if (pDVar3 != (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                       *)0x0) {
          ::Lib::
          DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::~DHMap(pDVar3);
          pDVar3->_timestamp = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
          pDVar3->_size = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pDVar3;
        }
        goto LAB_00632244;
      }
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"declare-datatype","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_3c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        pLVar9 = Shell::LispListReader::readNext((LispListReader *)&local_758);
        pLVar10 = Shell::LispListReader::readList((LispListReader *)&local_758);
        readDeclareDatatype(local_750,pLVar9,pLVar10);
        goto LAB_00631ecf;
      }
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"declare-datatypes","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_3e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        pLVar10 = Shell::LispListReader::readList((LispListReader *)&local_758);
        pLVar12 = Shell::LispListReader::readList((LispListReader *)&local_758);
        bVar6 = false;
LAB_00632420:
        readDeclareDatatypes(local_750,pLVar10,pLVar12,bVar6);
        goto LAB_00631ecf;
      }
      local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"declare-codatatypes","")
      ;
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_400);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != &local_400.field_2) {
        operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        pLVar10 = Shell::LispListReader::readList((LispListReader *)&local_758);
        pLVar12 = Shell::LispListReader::readList((LispListReader *)&local_758);
        bVar6 = true;
        goto LAB_00632420;
      }
      local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"declare-const","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_420);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        Shell::LispListReader::readAtom_abi_cxx11_(&local_728,(LispListReader *)&local_758);
        if (local_758._lst == (LExprList *)0x0) {
          puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6e8,"declare-const expects a const definition body","");
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_6e8);
          local_708._M_dataplus._M_p = (pointer)*plVar16;
          psVar17 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_708._M_dataplus._M_p == psVar17) {
            local_708.field_2._M_allocated_capacity = *psVar17;
            local_708.field_2._8_8_ = plVar16[3];
            local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
          }
          else {
            local_708.field_2._M_allocated_capacity = *psVar17;
          }
          local_708._M_string_length = plVar16[1];
          *plVar16 = (long)psVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Shell::LispParser::Expression::toString_abi_cxx11_
                    (&local_6c8,local_750->_topLevelExpr,true);
          std::operator+(in_stack_fffffffffffff8a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          plVar16 = (long *)std::__cxx11::string::append(local_748);
          local_1b0 = (long *)*plVar16;
          plVar18 = plVar16 + 2;
          if (local_1b0 == plVar18) {
            local_1a0 = *plVar18;
            uStack_198 = (undefined4)plVar16[3];
            uStack_194 = *(undefined4 *)((long)plVar16 + 0x1c);
            local_1b0 = &local_1a0;
          }
          else {
            local_1a0 = *plVar18;
          }
          local_1a8 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          *puVar15 = &PTR_cry_00b69f40;
          puVar15[1] = puVar15 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar15 + 1),local_1b0,local_1a8 + (long)local_1b0);
          *puVar15 = &PTR_cry_00b6a028;
          *(undefined4 *)(puVar15 + 5) = 0;
          puVar15[6] = puVar15 + 8;
          puVar15[7] = 0;
          *(undefined1 *)(puVar15 + 8) = 0;
          __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        pLVar9 = Shell::LispListReader::readNext((LispListReader *)&local_758);
        pTVar11 = (TermLookup *)::Lib::FixedSizeAllocator<48UL>::alloc(local_670);
        pTVar11->_timestamp = 1;
        pTVar11->_size = 0;
        pTVar11->_deleted = 0;
        pTVar11->_capacityIndex = 0;
        pTVar11->_capacity = 0;
        *(undefined8 *)&pTVar11->_nextExpansionOccupancy = 0;
        *(undefined8 *)((long)&pTVar11->_entries + 4) = 0;
        *(undefined4 *)((long)&pTVar11->_afterLast + 4) = 0;
        if ((local_750->_scopes)._cursor == (local_750->_scopes)._end) {
          ::Lib::
          Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
          ::expand(local_678);
        }
        *(local_750->_scopes)._cursor = pTVar11;
        pppDVar1 = &(local_750->_scopes)._cursor;
        *pppDVar1 = *pppDVar1 + 1;
        if (((pLVar9->tag == LIST) &&
            (Shell::LispListReader::LispListReader((LispListReader *)local_748,pLVar9),
            (LExprList *)local_748._0_8_ != (LExprList *)0x0)) &&
           (pLVar13 = Shell::LispListReader::peekAtNext((LispListReader *)local_748),
           pLVar13->tag == ATOM)) {
          pLVar13 = Shell::LispListReader::peekAtNext((LispListReader *)local_748);
          iVar7 = std::__cxx11::string::compare((char *)&pLVar13->str);
          if (iVar7 == 0) {
            Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
            Shell::LispListReader::readAtom_abi_cxx11_(&local_b0,(LispListReader *)local_748);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            readTypeParameters(local_750,(LispListReader *)local_748,pTVar11,(TermStack *)0x0);
            pLVar9 = Shell::LispListReader::readNext((LispListReader *)local_748);
            local_758._lst = (List<Shell::LispParser::Expression_*> *)local_748._0_8_;
          }
        }
        readDeclareFun(local_750,&local_728,(LExprList *)0x0,pLVar9,pTVar11->_size);
        Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
        goto LAB_0063220a;
      }
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"define-fun","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_440);
      if (bVar6) {
        uVar8 = 1;
        local_67c = 0;
      }
      else {
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"define-fun-rec","");
        bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_460);
        uVar8 = (uint)CONCAT71(extraout_var,bVar6);
        local_67c = uVar8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      if ((char)uVar8 != '\0') {
        Shell::LispListReader::readAtom_abi_cxx11_(&local_728,(LispListReader *)&local_758);
        pLVar10 = Shell::LispListReader::readList((LispListReader *)&local_758);
        local_660._M_dataplus._M_p = (pointer)pLVar10;
        pTVar11 = (TermLookup *)::Lib::FixedSizeAllocator<48UL>::alloc(local_670);
        pTVar11->_timestamp = 1;
        pTVar11->_size = 0;
        pTVar11->_deleted = 0;
        pTVar11->_capacityIndex = 0;
        pTVar11->_capacity = 0;
        *(undefined8 *)&pTVar11->_nextExpansionOccupancy = 0;
        *(undefined8 *)((long)&pTVar11->_entries + 4) = 0;
        *(undefined4 *)((long)&pTVar11->_afterLast + 4) = 0;
        local_748._16_8_ = 0;
        local_748._24_8_ = 0;
        local_748._0_8_ = (LExprList *)0x0;
        local_748._8_8_ = (TermList *)0x0;
        if ((local_750->_scopes)._cursor == (local_750->_scopes)._end) {
          ::Lib::
          Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
          ::expand(local_678);
        }
        *(local_750->_scopes)._cursor = pTVar11;
        pppDVar1 = &(local_750->_scopes)._cursor;
        *pppDVar1 = *pppDVar1 + 1;
        if (((LExprList *)local_660._M_dataplus._M_p != (LExprList *)0x0) &&
           (pLVar9 = Shell::LispListReader::peekAtNext((LispListReader *)&local_660),
           pLVar9->tag == ATOM)) {
          pLVar9 = Shell::LispListReader::peekAtNext((LispListReader *)&local_660);
          iVar7 = std::__cxx11::string::compare((char *)&pLVar9->str);
          if (iVar7 == 0) {
            Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
            Shell::LispListReader::readAtom_abi_cxx11_(&local_d0,(LispListReader *)&local_660);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            readTypeParameters(local_750,(LispListReader *)&local_660,pTVar11,(TermStack *)local_748
                              );
            pLVar10 = Shell::LispListReader::readList((LispListReader *)&local_660);
            local_758._lst = (List<Shell::LispParser::Expression_*> *)local_660._M_dataplus._M_p;
          }
        }
        if (local_758._lst == (LExprList *)0x0) {
          puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
          local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6c8,"define-fun expects an output sort","");
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_6c8);
          local_6e8._M_dataplus._M_p = (pointer)*plVar16;
          psVar17 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_6e8._M_dataplus._M_p == psVar17) {
            local_6e8.field_2._M_allocated_capacity = *psVar17;
            local_6e8.field_2._8_8_ = plVar16[3];
            local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          }
          else {
            local_6e8.field_2._M_allocated_capacity = *psVar17;
          }
          local_6e8._M_string_length = plVar16[1];
          *plVar16 = (long)psVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Shell::LispParser::Expression::toString_abi_cxx11_
                    (&local_6a0,local_750->_topLevelExpr,true);
          std::operator+(in_stack_fffffffffffff8a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_708);
          local_1d0 = (long *)*plVar16;
          plVar18 = plVar16 + 2;
          if (local_1d0 == plVar18) {
            local_1c0 = *plVar18;
            uStack_1b8 = (undefined4)plVar16[3];
            uStack_1b4 = *(undefined4 *)((long)plVar16 + 0x1c);
            local_1d0 = &local_1c0;
          }
          else {
            local_1c0 = *plVar18;
          }
          local_1c8 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          *puVar15 = &PTR_cry_00b69f40;
          puVar15[1] = puVar15 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar15 + 1),local_1d0,local_1c8 + (long)local_1d0);
          *puVar15 = &PTR_cry_00b6a028;
          *(undefined4 *)(puVar15 + 5) = 0;
          puVar15[6] = puVar15 + 8;
          puVar15[7] = 0;
          *(undefined1 *)(puVar15 + 8) = 0;
          __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        pLVar9 = Shell::LispListReader::readNext((LispListReader *)&local_758);
        if (local_758._lst == (LExprList *)0x0) {
          puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
          local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6c8,"define-fun expects a fun definition body","");
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_6c8);
          local_6e8._M_dataplus._M_p = (pointer)*plVar16;
          psVar17 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_6e8._M_dataplus._M_p == psVar17) {
            local_6e8.field_2._M_allocated_capacity = *psVar17;
            local_6e8.field_2._8_8_ = plVar16[3];
            local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          }
          else {
            local_6e8.field_2._M_allocated_capacity = *psVar17;
          }
          local_6e8._M_string_length = plVar16[1];
          *plVar16 = (long)psVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Shell::LispParser::Expression::toString_abi_cxx11_
                    (&local_6a0,local_750->_topLevelExpr,true);
          std::operator+(in_stack_fffffffffffff8a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_708);
          local_1f0 = (long *)*plVar16;
          plVar18 = plVar16 + 2;
          if (local_1f0 == plVar18) {
            local_1e0 = *plVar18;
            uStack_1d8 = (undefined4)plVar16[3];
            uStack_1d4 = *(undefined4 *)((long)plVar16 + 0x1c);
            local_1f0 = &local_1e0;
          }
          else {
            local_1e0 = *plVar18;
          }
          local_1e8 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          *puVar15 = &PTR_cry_00b69f40;
          puVar15[1] = puVar15 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar15 + 1),local_1f0,local_1e8 + (long)local_1f0);
          *puVar15 = &PTR_cry_00b6a028;
          *(undefined4 *)(puVar15 + 5) = 0;
          puVar15[6] = puVar15 + 8;
          puVar15[7] = 0;
          *(undefined1 *)(puVar15 + 8) = 0;
          __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        pLVar13 = Shell::LispListReader::readNext((LispListReader *)&local_758);
        in_stack_fffffffffffff898 = local_67c & 0xff;
        readDefineFun(local_750,&local_728,pLVar10,pLVar9,pLVar13,(TermStack *)local_748,
                      SUB41(local_67c,0));
        Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
        ppDVar2 = (local_750->_scopes)._cursor;
        (local_750->_scopes)._cursor = ppDVar2 + -1;
        pDVar3 = ppDVar2[-1];
        if (pDVar3 != (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                       *)0x0) {
          ::Lib::
          DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::~DHMap(pDVar3);
          pDVar3->_timestamp = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
          pDVar3->_size = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pDVar3;
        }
        ::Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)local_748);
        goto LAB_00632244;
      }
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"define-funs-rec","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_480);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != &local_480.field_2) {
        operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        pLVar10 = Shell::LispListReader::readList((LispListReader *)&local_758);
        pLVar12 = Shell::LispListReader::readList((LispListReader *)&local_758);
        readDefineFunsRec(local_750,pLVar10,pLVar12);
        goto LAB_00631ed4;
      }
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"assert","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_4a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        if (local_758._lst == (LExprList *)0x0) {
          puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
          local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_708,"assert expects a body","");
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_708);
          local_748._0_8_ = *plVar16;
          psVar17 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_748._0_8_ == psVar17) {
            local_748._16_8_ = *psVar17;
            local_748._24_8_ = plVar16[3];
            local_748._0_8_ = local_748 + 0x10;
          }
          else {
            local_748._16_8_ = *psVar17;
          }
          local_748._8_8_ = plVar16[1];
          *plVar16 = (long)psVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Shell::LispParser::Expression::toString_abi_cxx11_
                    (&local_6e8,local_750->_topLevelExpr,true);
          std::operator+(in_stack_fffffffffffff8a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_728);
          local_210 = (long *)*plVar16;
          plVar18 = plVar16 + 2;
          if (local_210 == plVar18) {
            local_200 = *plVar18;
            uStack_1f8 = (undefined4)plVar16[3];
            uStack_1f4 = *(undefined4 *)((long)plVar16 + 0x1c);
            local_210 = &local_200;
          }
          else {
            local_200 = *plVar18;
          }
          local_208 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          *puVar15 = &PTR_cry_00b69f40;
          puVar15[1] = puVar15 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar15 + 1),local_210,local_208 + (long)local_210);
          *puVar15 = &PTR_cry_00b6a028;
          *(undefined4 *)(puVar15 + 5) = 0;
          puVar15[6] = puVar15 + 8;
          puVar15[7] = 0;
          *(undefined1 *)(puVar15 + 8) = 0;
          __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        pLVar9 = Shell::LispListReader::readNext((LispListReader *)&local_758);
        readAssert(local_750,pLVar9);
        goto LAB_00631ecf;
      }
      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"assert-claim","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_4c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        if (local_758._lst == (LExprList *)0x0) {
          puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
          local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_708,"assert expects a body","");
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_708);
          local_748._0_8_ = *plVar16;
          psVar17 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_748._0_8_ == psVar17) {
            local_748._16_8_ = *psVar17;
            local_748._24_8_ = plVar16[3];
            local_748._0_8_ = local_748 + 0x10;
          }
          else {
            local_748._16_8_ = *psVar17;
          }
          local_748._8_8_ = plVar16[1];
          *plVar16 = (long)psVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Shell::LispParser::Expression::toString_abi_cxx11_
                    (&local_6e8,local_750->_topLevelExpr,true);
          std::operator+(in_stack_fffffffffffff8a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_728);
          local_230 = (long *)*plVar16;
          plVar18 = plVar16 + 2;
          if (local_230 == plVar18) {
            local_220 = *plVar18;
            uStack_218 = (undefined4)plVar16[3];
            uStack_214 = *(undefined4 *)((long)plVar16 + 0x1c);
            local_230 = &local_220;
          }
          else {
            local_220 = *plVar18;
          }
          local_228 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          *puVar15 = &PTR_cry_00b69f40;
          puVar15[1] = puVar15 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar15 + 1),local_230,local_228 + (long)local_230);
          *puVar15 = &PTR_cry_00b6a028;
          *(undefined4 *)(puVar15 + 5) = 0;
          puVar15[6] = puVar15 + 8;
          puVar15[7] = 0;
          *(undefined1 *)(puVar15 + 8) = 0;
          __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        pLVar9 = Shell::LispListReader::readNext((LispListReader *)&local_758);
        readAssertClaim(local_750,pLVar9);
        goto LAB_00631ecf;
      }
      local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"assert-not","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_4e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
        operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        if (local_758._lst == (LExprList *)0x0) {
          puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
          local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_708,"assert-not expects a body","");
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_708);
          local_748._0_8_ = *plVar16;
          psVar17 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_748._0_8_ == psVar17) {
            local_748._16_8_ = *psVar17;
            local_748._24_8_ = plVar16[3];
            local_748._0_8_ = local_748 + 0x10;
          }
          else {
            local_748._16_8_ = *psVar17;
          }
          local_748._8_8_ = plVar16[1];
          *plVar16 = (long)psVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Shell::LispParser::Expression::toString_abi_cxx11_
                    (&local_6e8,local_750->_topLevelExpr,true);
          std::operator+(in_stack_fffffffffffff8a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_728);
          local_250 = (long *)*plVar16;
          plVar18 = plVar16 + 2;
          if (local_250 == plVar18) {
            local_240 = *plVar18;
            uStack_238 = (undefined4)plVar16[3];
            uStack_234 = *(undefined4 *)((long)plVar16 + 0x1c);
            local_250 = &local_240;
          }
          else {
            local_240 = *plVar18;
          }
          local_248 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          *puVar15 = &PTR_cry_00b69f40;
          puVar15[1] = puVar15 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar15 + 1),local_250,local_248 + (long)local_250);
          *puVar15 = &PTR_cry_00b6a028;
          *(undefined4 *)(puVar15 + 5) = 0;
          puVar15[6] = puVar15 + 8;
          puVar15[7] = 0;
          *(undefined1 *)(puVar15 + 8) = 0;
          __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        pLVar9 = Shell::LispListReader::readNext((LispListReader *)&local_758);
        readAssertNot(local_750,pLVar9);
        goto LAB_00631ecf;
      }
      local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"assert-theory","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_500);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._M_dataplus._M_p != &local_500.field_2) {
        operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        if (local_758._lst == (LExprList *)0x0) {
          puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
          local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_708,"assert-theory expects a body","");
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_708);
          local_748._0_8_ = *plVar16;
          psVar17 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_748._0_8_ == psVar17) {
            local_748._16_8_ = *psVar17;
            local_748._24_8_ = plVar16[3];
            local_748._0_8_ = local_748 + 0x10;
          }
          else {
            local_748._16_8_ = *psVar17;
          }
          local_748._8_8_ = plVar16[1];
          *plVar16 = (long)psVar17;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Shell::LispParser::Expression::toString_abi_cxx11_
                    (&local_6e8,local_750->_topLevelExpr,true);
          std::operator+(in_stack_fffffffffffff8a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_728);
          local_270 = (long *)*plVar16;
          plVar18 = plVar16 + 2;
          if (local_270 == plVar18) {
            local_260 = *plVar18;
            uStack_258 = (undefined4)plVar16[3];
            uStack_254 = *(undefined4 *)((long)plVar16 + 0x1c);
            local_270 = &local_260;
          }
          else {
            local_260 = *plVar18;
          }
          local_268 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          *puVar15 = &PTR_cry_00b69f40;
          puVar15[1] = puVar15 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar15 + 1),local_270,local_268 + (long)local_270);
          *puVar15 = &PTR_cry_00b6a028;
          *(undefined4 *)(puVar15 + 5) = 0;
          puVar15[6] = puVar15 + 8;
          puVar15[7] = 0;
          *(undefined1 *)(puVar15 + 8) = 0;
          __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        pLVar9 = Shell::LispListReader::readNext((LispListReader *)&local_758);
        readAssertTheory(local_750,pLVar9);
        goto LAB_00631ecf;
      }
      local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"color-symbol","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_520);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        Shell::LispListReader::readAtom_abi_cxx11_(&local_728,(LispListReader *)&local_758);
        local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,":left","");
        bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_540);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._M_dataplus._M_p != &local_540.field_2) {
          operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
        }
        color = COLOR_LEFT;
        if (!bVar6) {
          local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,":right","");
          bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_560);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_560._M_dataplus._M_p != &local_560.field_2) {
            operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
          }
          color = COLOR_RIGHT;
          if (!bVar6) {
            puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
            Shell::LispListReader::readAtom_abi_cxx11_(&local_6a0,(LispListReader *)&local_758);
            std::operator+(&local_6c8,"\'",&local_6a0);
            plVar16 = (long *)std::__cxx11::string::append((char *)&local_6c8);
            local_6e8._M_dataplus._M_p = (pointer)*plVar16;
            psVar17 = (size_type *)(plVar16 + 2);
            if ((size_type *)local_6e8._M_dataplus._M_p == psVar17) {
              local_6e8.field_2._M_allocated_capacity = *psVar17;
              local_6e8.field_2._8_8_ = plVar16[3];
              local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
            }
            else {
              local_6e8.field_2._M_allocated_capacity = *psVar17;
            }
            local_6e8._M_string_length = plVar16[1];
            *plVar16 = (long)psVar17;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            plVar16 = (long *)std::__cxx11::string::append((char *)&local_6e8);
            local_708._M_dataplus._M_p = (pointer)*plVar16;
            psVar17 = (size_type *)(plVar16 + 2);
            if ((size_type *)local_708._M_dataplus._M_p == psVar17) {
              local_708.field_2._M_allocated_capacity = *psVar17;
              local_708.field_2._8_8_ = plVar16[3];
              local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
            }
            else {
              local_708.field_2._M_allocated_capacity = *psVar17;
            }
            local_708._M_string_length = plVar16[1];
            *plVar16 = (long)psVar17;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            Shell::LispParser::Expression::toString_abi_cxx11_
                      (&local_660,local_750->_topLevelExpr,true);
            std::operator+(in_stack_fffffffffffff8a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
            plVar16 = (long *)std::__cxx11::string::append(local_748);
            local_290 = (long *)*plVar16;
            plVar18 = plVar16 + 2;
            if (local_290 == plVar18) {
              local_280 = *plVar18;
              uStack_278 = (undefined4)plVar16[3];
              uStack_274 = *(undefined4 *)((long)plVar16 + 0x1c);
              local_290 = &local_280;
            }
            else {
              local_280 = *plVar18;
            }
            local_288 = plVar16[1];
            *plVar16 = (long)plVar18;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            *puVar15 = &PTR_cry_00b69f40;
            puVar15[1] = puVar15 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar15 + 1),local_290,local_288 + (long)local_290);
            *puVar15 = &PTR_cry_00b6a028;
            *(undefined4 *)(puVar15 + 5) = 0;
            puVar15[6] = puVar15 + 8;
            puVar15[7] = 0;
            *(undefined1 *)(puVar15 + 8) = 0;
            __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                        ::Lib::UserErrorException::~UserErrorException);
          }
        }
        colorSymbol(local_750,&local_728,color);
        Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
        goto LAB_00632244;
      }
      local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"check-sat","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_580);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._M_dataplus._M_p != &local_580.field_2) {
        operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
        local_668 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
LAB_00632e4d:
        bVar4 = false;
      }
      else {
        local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"exit","");
        bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_5a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
        }
        if (bVar6) {
          Shell::LispListReader::acceptEOL((LispListReader *)&local_6a8);
          goto LAB_00632e4d;
        }
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"reset","");
        bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_5c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
        }
        bVar4 = true;
        if (!bVar6) {
          local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"set-option","");
          bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_5e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
            operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
          }
          if (bVar6) {
            local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,":uncomputable","")
            ;
            bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_600);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_600._M_dataplus._M_p != &local_600.field_2) {
              operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar6) {
              pLVar14 = Shell::LispListReader::readList((LispListReader *)&local_758);
              while (pLVar14 != (LExprList *)0x0) {
                ppEVar5 = &pLVar14->_head;
                pLVar14 = pLVar14->_tail;
                markSymbolUncomputable(local_750,&(*ppEVar5)->str);
              }
              Shell::LispListReader::acceptEOL((LispListReader *)&local_758);
            }
          }
          else {
            local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"push","");
            bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_620);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_620._M_dataplus._M_p != &local_620.field_2) {
              operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1
                             );
            }
            if (!bVar6) {
              local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"get-info","");
              bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_758,&local_640);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_640._M_dataplus._M_p != &local_640.field_2) {
                operator_delete(local_640._M_dataplus._M_p,
                                local_640.field_2._M_allocated_capacity + 1);
              }
              if (!bVar6) {
                puVar15 = (undefined8 *)__cxa_allocate_exception(0x50);
                Shell::LispListReader::readAtom_abi_cxx11_(&local_6e8,(LispListReader *)&local_758);
                std::operator+(&local_708,"unrecognized entry ",&local_6e8);
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_708);
                local_748._0_8_ = *plVar16;
                psVar17 = (size_type *)(plVar16 + 2);
                if ((size_type *)local_748._0_8_ == psVar17) {
                  local_748._16_8_ = *psVar17;
                  local_748._24_8_ = plVar16[3];
                  local_748._0_8_ = local_748 + 0x10;
                }
                else {
                  local_748._16_8_ = *psVar17;
                }
                local_748._8_8_ = plVar16[1];
                *plVar16 = (long)psVar17;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                Shell::LispParser::Expression::toString_abi_cxx11_
                          (&local_6c8,local_750->_topLevelExpr,true);
                std::operator+(in_stack_fffffffffffff8a0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_728);
                local_2b0 = (long *)*plVar16;
                plVar18 = plVar16 + 2;
                if (local_2b0 == plVar18) {
                  local_2a0 = *plVar18;
                  uStack_298 = (undefined4)plVar16[3];
                  uStack_294 = *(undefined4 *)((long)plVar16 + 0x1c);
                  local_2b0 = &local_2a0;
                }
                else {
                  local_2a0 = *plVar18;
                }
                local_2a8 = plVar16[1];
                *plVar16 = (long)plVar18;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                *puVar15 = &PTR_cry_00b69f40;
                puVar15[1] = puVar15 + 3;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)(puVar15 + 1),local_2b0,local_2a8 + (long)local_2b0);
                *puVar15 = &PTR_cry_00b6a028;
                *(undefined4 *)(puVar15 + 5) = 0;
                puVar15[6] = puVar15 + 8;
                puVar15[7] = 0;
                *(undefined1 *)(puVar15 + 8) = 0;
                __cxa_throw(puVar15,&::Lib::UserErrorException::typeinfo,
                            ::Lib::UserErrorException::~UserErrorException);
              }
            }
          }
        }
      }
    }
  } while (bVar4);
  if (((local_668 & 1) != 0) && (local_6a8._lst != (LExprList *)0x0)) {
    do {
      pLVar9 = Shell::LispListReader::readNext((LispListReader *)&local_6a8);
      Shell::LispListReader::LispListReader((LispListReader *)&local_728,pLVar9);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"exit","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_728,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        Shell::LispListReader::acceptEOL((LispListReader *)&local_728);
        Shell::LispListReader::acceptEOL((LispListReader *)&local_6a8);
        return;
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"get-unsat-core","");
      bVar6 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&local_728,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if (!bVar6) {
        if (*(int *)(::Lib::env + 0x7500) == 0xb) {
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "% Warning: check-sat is not the last entry. Skipping the rest!",0x3e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        return;
      }
      *(undefined4 *)(::Lib::env + 0xd260) = 4;
      Shell::LispListReader::acceptEOL((LispListReader *)&local_728);
    } while (local_6a8._lst != (LExprList *)0x0);
  }
  return;
}

Assistant:

void SMTLIB2::readBenchmark(LExprList* bench)
{
  LispListReader bRdr(bench);

  bool afterCheckSat = false;

  // iteration over benchmark top level entries
  while(bRdr.hasNext()) {
    LExpr* lexp = bRdr.next();
    _topLevelExpr = lexp;
    _nextVar = 0;

    LOG2("readBenchmark ",lexp->toString(true));

    LispListReader ibRdr(lexp);

    if (ibRdr.tryAcceptAtom("set-logic")) {
      if (_logicSet) {
        USER_ERROR_EXPR("set-logic can appear only once in a problem");
      }
      readLogic(ibRdr.readAtom());
      ibRdr.acceptEOL();
      continue;
    }

    if (ibRdr.tryAcceptAtom("set-info")) {

      if (ibRdr.tryAcceptAtom(":status")) {
        _statusStr = ibRdr.readAtom();
        ibRdr.acceptEOL();
        continue;
      }

      if (ibRdr.tryAcceptAtom(":source")) {
        _sourceInfo = ibRdr.readAtom();
        ibRdr.acceptEOL();
        continue;
      }

      // ignore unknown info
      ibRdr.readAtom();
      ibRdr.readAtom();
      ibRdr.acceptEOL();
      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-sort")) {
      std::string name = ibRdr.readAtom();
      std::string arity;
      if (!ibRdr.tryReadAtom(arity)) {
        USER_ERROR_EXPR("Unspecified arity while declaring sort: "+name);
      }

      readDeclareSort(name,arity);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("define-sort")) {
      std::string name = ibRdr.readAtom();
      LExprList* args = ibRdr.readList();

      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("define-sort expects a sort definition body");
      }
      LExpr* body = ibRdr.readNext();

      readDefineSort(name,args,body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-fun")) {
      std::string name = ibRdr.readAtom();
      LExprList* iSorts = ibRdr.readList();
      LispListReader iSortRdr(iSorts);
      auto lookup = new TermLookup();
      _scopes.push(lookup);
      if (iSortRdr.hasNext() && iSortRdr.peekAtNext()->isAtom() && iSortRdr.peekAtNext()->str == PAR) {
        ibRdr.acceptEOL();
        iSortRdr.readAtom(); // the "par" atom
        readTypeParameters(iSortRdr, lookup);
        iSorts = iSortRdr.readList();
        ibRdr = iSortRdr;
      }
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("declare-fun expects an output sort");
      }
      LExpr* oSort = ibRdr.readNext();

      readDeclareFun(name,iSorts,oSort,lookup->size());

      ibRdr.acceptEOL();
      delete _scopes.pop();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-datatype")) {
      LExpr *sort = ibRdr.readNext();
      LExprList *datatype = ibRdr.readList();

      readDeclareDatatype(sort, datatype);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-datatypes")) {
      LExprList* sorts = ibRdr.readList();
      LExprList* datatypes = ibRdr.readList();

      readDeclareDatatypes(sorts, datatypes, false);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-codatatypes")) {
      LExprList* sorts = ibRdr.readList();
      LExprList* datatypes = ibRdr.readList();

      readDeclareDatatypes(sorts, datatypes, true);

      ibRdr.acceptEOL();

      continue;
    }
    
    if (ibRdr.tryAcceptAtom("declare-const")) {
      std::string name = ibRdr.readAtom();
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("declare-const expects a const definition body");
      }
      LExpr* oSort = ibRdr.readNext();
      auto lookup = new TermLookup();
      _scopes.push(lookup);
      if (oSort->isList()) {
        LispListReader oSortRdr(oSort);
        if (oSortRdr.hasNext() && oSortRdr.peekAtNext()->isAtom() && oSortRdr.peekAtNext()->str == PAR) {
          ibRdr.acceptEOL();
          oSortRdr.readAtom(); // the "par" atom
          readTypeParameters(oSortRdr, lookup);
          oSort = oSortRdr.readNext();
          ibRdr = oSortRdr;
        }
      }

      readDeclareFun(name,nullptr,oSort,lookup->size());

      ibRdr.acceptEOL();
      delete _scopes.pop();

      continue;
    }

    bool recursive = false;
    if (ibRdr.tryAcceptAtom("define-fun") || (recursive = ibRdr.tryAcceptAtom("define-fun-rec"))) {
      std::string name = ibRdr.readAtom();
      LExprList* iArgs = ibRdr.readList();
      LispListReader iArgRdr(iArgs);
      auto lookup = new TermLookup();
      TermStack typeArgs;
      _scopes.push(lookup);
      if (iArgRdr.hasNext() && iArgRdr.peekAtNext()->isAtom() && iArgRdr.peekAtNext()->str == PAR) {
        ibRdr.acceptEOL();
        iArgRdr.readAtom(); // the "par" atom
        readTypeParameters(iArgRdr, lookup, &typeArgs);
        iArgs = iArgRdr.readList();
        ibRdr = iArgRdr;
      }
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("define-fun expects an output sort");
      }
      LExpr* oSort = ibRdr.readNext();
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("define-fun expects a fun definition body");
      }
      LExpr* body = ibRdr.readNext();

      readDefineFun(name,iArgs,oSort,body,typeArgs,recursive);

      ibRdr.acceptEOL();
      delete _scopes.pop();

      continue;
    }

    if (ibRdr.tryAcceptAtom("define-funs-rec")) {
      LExprList* declarations = ibRdr.readList();
      LExprList* definitions = ibRdr.readList();

      readDefineFunsRec(declarations, definitions);

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssert(body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert-claim")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssertClaim(body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert-not")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert-not expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssertNot(body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert-theory")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert-theory expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssertTheory(body);

      ibRdr.acceptEOL();

      continue;
    }

    // not an official SMTLIB command
    if (ibRdr.tryAcceptAtom("color-symbol")) {
      std::string symbol = ibRdr.readAtom();

      if (ibRdr.tryAcceptAtom(":left")) {
        colorSymbol(symbol, Color::COLOR_LEFT);
      } else if (ibRdr.tryAcceptAtom(":right")) {
        colorSymbol(symbol, Color::COLOR_RIGHT);
      } else {
        USER_ERROR_EXPR("'"+ibRdr.readAtom()+"' is not a color keyword");
      }

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("check-sat")) {
      ibRdr.acceptEOL();
      afterCheckSat = true;
      break;
    }

    if (ibRdr.tryAcceptAtom("exit")) {
      bRdr.acceptEOL();
      break;
    }

    if (ibRdr.tryAcceptAtom("reset")) {
      LOG1("ignoring reset");
      continue;
    }

    if (ibRdr.tryAcceptAtom("set-option")) {
      if (ibRdr.tryAcceptAtom(":uncomputable")) {
        LExprList* lel = ibRdr.readList();
        LExprList::Iterator lIt(lel);
        while (lIt.hasNext()) {
          LExpr* exp = lIt.next();
          ASS(exp->isAtom());
          std::string& name = exp->str;
          markSymbolUncomputable(name);
        }
        ibRdr.acceptEOL();
        continue;
      }
      LOG2("ignoring set-option", ibRdr.readAtom());
      continue;
    }

    if (ibRdr.tryAcceptAtom("push")) {
      LOG1("ignoring push");
      continue;
    }

    if (ibRdr.tryAcceptAtom("get-info")) {
      LOG2("ignoring get-info", ibRdr.readAtom());
      continue;
    }

    USER_ERROR_EXPR("unrecognized entry "+ibRdr.readAtom());
  }
  
  // the above while loop is aborted on the first check-sat,
  // however, we want to learn about an unsat core printing request
  // (or other things we might support in the future)
  if (afterCheckSat) {
    while(bRdr.hasNext()) {
      LispListReader ibRdr(bRdr.next());
      
      if (ibRdr.tryAcceptAtom("exit")) {
        ibRdr.acceptEOL(); // no arguments of exit
        bRdr.acceptEOL();  // exit should be the last thing in the file
        break;
      }
      
      if (ibRdr.tryAcceptAtom("get-unsat-core")) {
        env.options->setOutputMode(Options::Output::UCORE);
        ibRdr.acceptEOL(); // no arguments of get-unsat-core
        continue;
      }
      
      // can't read anything else (and it does not make sense to read get-unsat-core more than once)
      // so let's just warn and exit
      if(env.options->mode()!=Options::Mode::SPIDER) {
        std::cout << "% Warning: check-sat is not the last entry. Skipping the rest!" << endl;
      }
      break;
    }
  }
}